

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flies.cpp
# Opt level: O2

int AF_A_FlySearch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  FState *newstate;
  AActor *fly;
  char *__assertion;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053b470;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    fly = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (fly == (AActor *)0x0) {
LAB_0053b382:
        fly = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)fly,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053b470;
        }
      }
      if (numparam == 1) goto LAB_0053b402;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053b460;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053b470;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053b460;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053b402:
        validcount = validcount + 1;
        pAVar3 = FindCorpse(fly,fly->Sector,5);
        if (pAVar3 != (AActor *)0x0) {
          (fly->target).field_0.p = pAVar3;
          FName::FName(&local_1c,"Buzz");
          newstate = AActor::FindState(fly,&local_1c);
          AActor::SetState(fly,newstate,false);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053b470;
    }
    if (fly == (AActor *)0x0) goto LAB_0053b382;
  }
LAB_0053b460:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053b470:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flies.cpp"
                ,0x3f,"int AF_A_FlySearch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FlySearch)
{
	// The version from the retail beta is not so great for general use:
	// 1. Pick one of the first fifty thinkers at random.
	// 2. Starting from that thinker, find one that is an actor, not itself,
	//    and within sight. Give up after 100 sequential thinkers.
	// It's effectively useless if there are more than 150 thinkers on a map.
	//
	// So search the sectors instead. We can't potentially find something all
	// the way on the other side of the map and we can't find invisible corpses,
	// but at least we aren't crippled on maps with lots of stuff going on.
	PARAM_ACTION_PROLOGUE;

	validcount++;
	AActor *other = FindCorpse(self, self->Sector, 5);
	if (other != NULL)
	{
		self->target = other;
		self->SetState(self->FindState("Buzz"));
	}
	return 0;
}